

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M_tree.cpp
# Opt level: O0

bool __thiscall M_tree::compare(M_tree *this)

{
  code *pcVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  ostream *poVar5;
  char *pcVar6;
  allocator local_331;
  string local_330 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0 [39];
  allocator local_289;
  string local_288 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248 [32];
  undefined1 local_228 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  differ;
  string local_208 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8 [32];
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_190;
  string local_188 [8];
  string item_1;
  allocator local_161;
  string local_160 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0 [32];
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  string local_a0 [8];
  string item;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_80;
  iterator it;
  int i;
  int n;
  string rm_head;
  allocator local_31;
  string local_30 [8];
  string cp_head;
  M_tree *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"cp ",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&n,"rm ",(allocator *)((long)&i + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 3));
  bVar2 = hash_cmp(this,this->pNode->hashn,this->ofolder->hashn);
  if (bVar2) {
    std::__cxx11::string::~string((string *)&n);
    std::__cxx11::string::~string(local_30);
    return true;
  }
  bVar2 = std::operator!=(&this->pNode->key,&this->ofolder->key);
  if (bVar2) {
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->pNode->key);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::__normal_iterator(&local_80);
    for (it._M_current._4_4_ = 0; it._M_current._4_4_ < (int)sVar3;
        it._M_current._4_4_ = it._M_current._4_4_ + 1) {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->pNode->key,(long)it._M_current._4_4_);
      std::__cxx11::string::string(local_a0,(string *)pvVar4);
      local_b0._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->ofolder->key);
      local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(&this->ofolder->key);
      local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                           (local_b0,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      )local_b8,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_a0);
      local_80 = (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )local_a8;
      local_c0._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&this->ofolder->key);
      bVar2 = __gnu_cxx::operator==(&local_80,&local_c0);
      if (bVar2) {
        poVar5 = std::operator<<((ostream *)&std::cout,"File: ");
        poVar5 = std::operator<<(poVar5,local_a0);
        poVar5 = std::operator<<(poVar5," are lost. We are copying");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        std::operator+(local_140,(char *)&this->folder_name1);
        std::operator+(local_120,local_140);
        std::operator+(local_100,(char *)local_120);
        std::operator+(local_e0,local_100);
        std::__cxx11::string::operator+=(local_30,(string *)local_e0);
        std::__cxx11::string::~string((string *)local_e0);
        std::__cxx11::string::~string((string *)local_100);
        std::__cxx11::string::~string((string *)local_120);
        std::__cxx11::string::~string((string *)local_140);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        system(pcVar6);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_160,"cp ",&local_161);
        std::__cxx11::string::operator=(local_30,local_160);
        std::__cxx11::string::~string(local_160);
        std::allocator<char>::~allocator((allocator<char> *)&local_161);
      }
      std::__cxx11::string::~string(local_a0);
    }
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->ofolder->key);
    for (it._M_current._4_4_ = 0; it._M_current._4_4_ < (int)sVar3;
        it._M_current._4_4_ = it._M_current._4_4_ + 1) {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->ofolder->key,(long)it._M_current._4_4_);
      std::__cxx11::string::string(local_188,(string *)pvVar4);
      local_198._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->pNode->key);
      local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end(&this->pNode->key);
      local_190 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                            (local_198,
                             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              )local_1a0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_188);
      local_80 = (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )local_190;
      local_1a8._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&this->pNode->key);
      bVar2 = __gnu_cxx::operator==(&local_80,&local_1a8);
      if (bVar2) {
        poVar5 = std::operator<<((ostream *)&std::cout,"File: ");
        poVar5 = std::operator<<(poVar5,local_188);
        poVar5 = std::operator<<(poVar5," are redundant. We are deleting");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        std::operator+(local_1e8,(char *)&this->folder_name2);
        std::operator+(local_1c8,local_1e8);
        std::__cxx11::string::operator+=((string *)&n,(string *)local_1c8);
        std::__cxx11::string::~string((string *)local_1c8);
        std::__cxx11::string::~string((string *)local_1e8);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        system(pcVar6);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_208,"rm ",
                   (allocator *)
                   ((long)&differ.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        std::__cxx11::string::operator=((string *)&n,local_208);
        std::__cxx11::string::~string(local_208);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&differ.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      }
      std::__cxx11::string::~string(local_188);
    }
    pcVar6 = (char *)std::__cxx11::string::c_str();
    build(this,pcVar6,3);
  }
  bVar2 = hash_cmp(this,this->pNode->hashn,this->ofolder->hashn);
  if (!bVar2) {
    compare_tree_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_228,this,this->pNode,this->ofolder);
    std::operator<<((ostream *)&std::cout,"Wrong files:\n");
    while (bVar2 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_228), ((bVar2 ^ 0xffU) & 1) != 0) {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_228);
      poVar5 = std::operator<<((ostream *)&std::cout,(string *)pvVar4);
      poVar5 = std::operator<<(poVar5," is wrong. We are fixing it...");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::operator+(local_268,(char *)&this->folder_name2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_228);
      std::operator+(local_248,local_268);
      std::__cxx11::string::operator+=((string *)&n,(string *)local_248);
      std::__cxx11::string::~string((string *)local_248);
      std::__cxx11::string::~string((string *)local_268);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      system(pcVar6);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_288,"rm ",&local_289);
      std::__cxx11::string::operator=((string *)&n,local_288);
      std::__cxx11::string::~string(local_288);
      std::allocator<char>::~allocator((allocator<char> *)&local_289);
      std::operator+(local_310,(char *)&this->folder_name1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_228);
      std::operator+(local_2f0,local_310);
      std::operator+(local_2d0,(char *)local_2f0);
      std::operator+(local_2b0,local_2d0);
      std::__cxx11::string::operator+=(local_30,(string *)local_2b0);
      std::__cxx11::string::~string((string *)local_2b0);
      std::__cxx11::string::~string((string *)local_2d0);
      std::__cxx11::string::~string((string *)local_2f0);
      std::__cxx11::string::~string((string *)local_310);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      system(pcVar6);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_330,"cp ",&local_331);
      std::__cxx11::string::operator=(local_30,local_330);
      std::__cxx11::string::~string(local_330);
      std::allocator<char>::~allocator((allocator<char> *)&local_331);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_228);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_228);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

bool M_tree::compare() {
    string cp_head = string("cp ");
    string rm_head = string("rm ");
    if(hash_cmp(this->pNode->hashn, this->ofolder->hashn)){
        return true;
    }else{
        if(this->pNode->key != this->ofolder->key){
            int n = this->pNode->key.size();
            int i;
            vector<string>::iterator it;
            for(i=0;i<n;i++){
                string item = this->pNode->key[i];
                it = find(this->ofolder->key.begin(), this->ofolder->key.end(), item);
                if(it == this->ofolder->key.end()){
                    //the file is not in fold2
                    cout << "File: " << item << " are lost. We are copying" << endl;
                    cp_head += folder_name1 + "/" + item + " " + folder_name2;
                    system(cp_head.c_str());
                    cp_head = string("cp ");
                }
            }
            n = this->ofolder->key.size();
            for(i = 0;i<n;i++){
                string item = this->ofolder->key[i];
                it = find(this->pNode->key.begin(), this->pNode->key.end(), item);
                if(it == this->pNode->key.end()){
                    //the file need to be deleted
                    cout << "File: " << item << " are redundant. We are deleting" << endl;
                    rm_head += folder_name2 + "/" + item;
                    system(rm_head.c_str());
                    rm_head = string("rm ");
                }
            }
            this->build(const_cast<char *>(folder_name2.c_str()), 3);
        }
        if(!hash_cmp(this->pNode->hashn, this->ofolder->hashn)){
            vector<string> differ(M_tree::compare_tree(this->pNode, this->ofolder));
            cout << "Wrong files:\n";
            while(!differ.empty()){
                cout << differ.back() << " is wrong. We are fixing it..." << endl;
                rm_head += this->folder_name2 + "/" + differ.back();
                system(rm_head.c_str());
                rm_head = string("rm ");
                cp_head += this->folder_name1 + "/" + differ.back() + " " + folder_name2;
                system(cp_head.c_str());
                cp_head = string("cp ");
                differ.pop_back();
            }
        }
    }
}